

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

mdns_string_t mdns_string_extract(void *buffer,size_t size,size_t *offset,char *str,size_t capacity)

{
  mdns_string_t mVar1;
  size_t sVar2;
  undefined1 *puVar3;
  size_t local_a0;
  size_t to_copy;
  ulong local_88;
  size_t local_80;
  size_t local_78;
  size_t remain;
  char *dst;
  mdns_string_pair_t substr;
  size_t end;
  size_t cur;
  size_t capacity_local;
  char *str_local;
  size_t *offset_local;
  size_t size_local;
  void *buffer_local;
  mdns_string_t result;
  
  end = *offset;
  substr.ref = -1;
  substr._20_4_ = 0xffffffff;
  result.str = (char *)0x0;
  local_78 = capacity;
  remain = (size_t)str;
  do {
    mdns_get_next_substring((mdns_string_pair_t *)&to_copy,buffer,size,end);
    dst = (char *)to_copy;
    substr.offset = local_88;
    substr.length = local_80;
    sVar2 = substr.length;
    if (to_copy == 0xffffffffffffffff) goto LAB_0037d6f6;
    substr.length._0_4_ = (int)local_80;
    if (((int)substr.length != 0) && (substr._16_8_ == -1)) {
      substr._16_8_ = end + 2;
    }
    substr.length = sVar2;
    if (local_88 != 0) {
      if (local_88 < local_78) {
        local_a0 = local_88;
      }
      else {
        local_a0 = local_78;
      }
      memcpy((void *)remain,(void *)((long)buffer + to_copy),local_a0);
      puVar3 = (undefined1 *)(local_a0 + remain);
      local_78 = local_78 - local_a0;
      remain = (size_t)puVar3;
      if (local_78 != 0) {
        remain = (size_t)(puVar3 + 1);
        *puVar3 = 0x2e;
        local_78 = local_78 - 1;
      }
    }
    end = (size_t)(dst + substr.offset);
  } while (substr.offset != 0);
  if (substr._16_8_ == -1) {
    substr._16_8_ = end + 1;
  }
  *offset = substr._16_8_;
  result.str = (char *)(capacity - local_78);
LAB_0037d6f6:
  mVar1.length = (size_t)result.str;
  mVar1.str = str;
  return mVar1;
}

Assistant:

mdns_string_t
mdns_string_extract(const void* buffer, size_t size, size_t* offset,
                    char* str, size_t capacity) {
	size_t cur = *offset;
	size_t end = MDNS_INVALID_POS;
	mdns_string_pair_t substr;
	mdns_string_t result = {str, 0};
	char* dst = str;
	size_t remain = capacity;
	do {
		substr = mdns_get_next_substring(buffer, size, cur);
		if (substr.offset == MDNS_INVALID_POS)
			return result;
		if (substr.ref && (end == MDNS_INVALID_POS))
			end = cur + 2;
		if (substr.length) {
			size_t to_copy = (substr.length < remain) ? substr.length : remain;
			memcpy(dst, (const char*)buffer + substr.offset, to_copy);
			dst += to_copy;
			remain -= to_copy;
			if (remain) {
				*dst++ = '.';
				--remain;
			}
		}
		cur = substr.offset + substr.length;
	}
	while (substr.length);

	if (end == MDNS_INVALID_POS)
		end = cur + 1;
	*offset = end;

	result.length = capacity - remain;
	return result;
}